

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_residual.c
# Opt level: O3

int h264_residual_block(bitstream *str,h264_cabac_context *cabac,h264_slice *slice,
                       h264_macroblock *mb,int32_t *block,int *num,int cat,int idx,int start,int end
                       ,int maxnumcoeff,int coded)

{
  int iVar1;
  ulong uVar2;
  
  if (cabac == (h264_cabac_context *)0x0) {
    if (coded == 0) {
      if (0 < maxnumcoeff) {
        uVar2 = 0;
        do {
          if (str->dir == VS_ENCODE) {
            if (block[uVar2] != 0) {
              h264_residual_block_cold_1();
              return 1;
            }
          }
          else {
            block[uVar2] = 0;
          }
          uVar2 = uVar2 + 1;
        } while ((uint)maxnumcoeff != uVar2);
      }
      iVar1 = 0;
      if (num != (int *)0x0) {
        *num = 0;
      }
    }
    else {
      iVar1 = h264_residual_cavlc(str,slice,block,num,cat,idx,start,end,maxnumcoeff);
    }
  }
  else {
    iVar1 = h264_residual_cabac(str,cabac,slice,mb,block,cat,idx,start,end,maxnumcoeff,coded);
  }
  return iVar1;
}

Assistant:

int h264_residual_block(struct bitstream *str, struct h264_cabac_context *cabac, struct h264_slice *slice, struct h264_macroblock *mb, int32_t *block, int *num, int cat, int idx, int start, int end, int maxnumcoeff, int coded) {
	if (!cabac) {
		if (!coded) {
			int i;
			for (i = 0; i < maxnumcoeff; i++) {
				if (str->dir == VS_ENCODE) {
					if (block[i]) {
						fprintf(stderr, "Non-zero coordinate in a skipped block!\n");
						return 1;
					}
				} else {
					block[i] = 0;
				}
			}
			if (num)
				*num = 0;
			return 0;
		} else {
			return h264_residual_cavlc(str, slice, block, num, cat, idx, start, end, maxnumcoeff);
		}
	} else {
		return h264_residual_cabac(str, cabac, slice, mb, block, cat, idx, start, end, maxnumcoeff, coded);
	}
}